

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int glyph1,int glyph2)

{
  uchar *puVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  
  lVar4 = (long)info->kern;
  if ((((lVar4 != 0) &&
       (puVar1 = info->data, puVar1[lVar4 + 3] != '\0' || puVar1[lVar4 + 2] != '\0')) &&
      ((ushort)(*(ushort *)(puVar1 + lVar4 + 8) << 8 | *(ushort *)(puVar1 + lVar4 + 8) >> 8) == 1))
     && (uVar7 = *(ushort *)(puVar1 + lVar4 + 10) << 8 | *(ushort *)(puVar1 + lVar4 + 10) >> 8,
        uVar7 != 0)) {
    uVar6 = glyph1 << 0x10 | glyph2;
    iVar3 = uVar7 - 1;
    iVar5 = 0;
    do {
      iVar8 = iVar3 + iVar5 >> 1;
      lVar2 = (long)iVar8 * 6;
      uVar9 = *(uint *)(puVar1 + lVar2 + lVar4 + 0x12);
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      if (uVar6 < uVar9) {
        iVar3 = iVar8 + -1;
      }
      else {
        if (uVar6 <= uVar9) {
          return (int)(short)((ushort)puVar1[lVar2 + lVar4 + 0x16] << 8) |
                 (uint)puVar1[lVar2 + lVar4 + 0x17];
        }
        iVar5 = iVar8 + 1;
      }
    } while (iVar5 <= iVar3);
  }
  return 0;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int glyph1, int glyph2)
{
   stbtt_uint8 *data = info->data + info->kern;
   stbtt_uint32 needle, straw;
   int l, r, m;

   // we only look at the first table. it must be 'horizontal' and format 0.
   if (!info->kern)
      return 0;
   if (ttUSHORT(data+2) < 1) // number of tables, need at least 1
      return 0;
   if (ttUSHORT(data+8) != 1) // horizontal flag must be set in format
      return 0;

   l = 0;
   r = ttUSHORT(data+10) - 1;
   needle = glyph1 << 16 | glyph2;
   while (l <= r) {
      m = (l + r) >> 1;
      straw = ttULONG(data+18+(m*6)); // note: unaligned read
      if (needle < straw)
         r = m - 1;
      else if (needle > straw)
         l = m + 1;
      else
         return ttSHORT(data+22+(m*6));
   }
   return 0;
}